

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O3

void __thiscall
booster::locale::boundary::details::
segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
::set(segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      *this,base_iterator p)

{
  uint uVar1;
  mapping_type *pmVar2;
  element_type *peVar3;
  wchar_t *pwVar4;
  unsigned_long uVar5;
  pointer pbVar6;
  long lVar7;
  unsigned_long uVar8;
  long lVar9;
  pointer pbVar10;
  difference_type __d;
  ulong uVar11;
  ulong uVar12;
  unsigned_long uVar13;
  difference_type __d_1;
  rule_type *prVar14;
  pointer pbVar15;
  
  pmVar2 = this->map_;
  peVar3 = (pmVar2->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pwVar4 = (pmVar2->begin_)._M_current;
  pbVar15 = (peVar3->
            super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar10 = (peVar3->
            super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)pbVar10 - (long)pbVar15;
  uVar5 = lVar7 >> 4;
  pbVar6 = pbVar15;
  if (0 < (long)uVar5) {
    uVar13 = uVar5;
    do {
      uVar11 = uVar13 >> 1;
      uVar12 = uVar11;
      if (pbVar6[uVar11].offset <= (ulong)((long)p._M_current - (long)pwVar4 >> 2)) {
        uVar12 = ~uVar11 + uVar13;
        pbVar6 = pbVar6 + uVar11 + 1;
      }
      uVar13 = uVar12;
    } while (0 < (long)uVar12);
  }
  uVar13 = uVar5;
  if (pbVar6 != pbVar10) {
    lVar9 = (long)pbVar6 - (long)pbVar15;
    do {
      if ((pbVar6->rule & this->mask_) != 0) {
        lVar7 = lVar9;
        uVar13 = lVar9 >> 4;
        pbVar10 = pbVar6;
        break;
      }
      pbVar6 = pbVar6 + 1;
      lVar9 = lVar9 + 0x10;
    } while (pbVar6 != pbVar10);
  }
  (this->current_).second = uVar13;
  (this->current_).first = uVar13;
  uVar8 = uVar13;
  if (this->full_select_ == true) {
    if (pbVar10 == pbVar15) goto LAB_00123d7f;
    prVar14 = &pbVar15[uVar13 - 1].rule;
    do {
      uVar8 = uVar8 - 1;
      if ((uVar8 == 0) || (uVar5 == uVar8)) break;
      uVar1 = *prVar14;
      prVar14 = prVar14 + -4;
    } while ((uVar1 & this->mask_) == 0);
  }
  else {
    if (pbVar10 == pbVar15) goto LAB_00123d7f;
    uVar8 = uVar13 - 1;
  }
  (this->current_).first = uVar8;
LAB_00123d7f:
  (this->value_).
  super_pair<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  .first._M_current = pwVar4;
  peVar3 = (pmVar2->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar9 = (long)(peVar3->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_start;
  pbVar15 = (peVar3->
            super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pbVar10 = (pointer)(lVar9 + uVar8 * 0x10);
  if ((long)pbVar15 - lVar9 >> 4 == uVar8) {
    pbVar10 = pbVar15 + -1;
  }
  pwVar4 = pwVar4 + pbVar10->offset;
  (this->value_).
  super_pair<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  .first._M_current = pwVar4;
  (this->value_).
  super_pair<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  .second._M_current = pwVar4;
  peVar3 = (pmVar2->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar9 = (long)(peVar3->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_start;
  pbVar15 = (peVar3->
            super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)pbVar15 - lVar9 >> 4;
  pbVar15 = pbVar15 + -1;
  pbVar10 = (pointer)(lVar7 + lVar9);
  if (uVar5 == uVar13) {
    pbVar10 = pbVar15;
  }
  pbVar6 = (pointer)(uVar8 * 0x10 + lVar9);
  if (uVar5 == uVar8) {
    pbVar6 = pbVar15;
  }
  (this->value_).
  super_pair<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  .second._M_current = pwVar4 + (pbVar10->offset - pbVar6->offset);
  if (uVar5 != uVar13) {
    (this->value_).rule_ = *(rule_type *)(lVar9 + 8 + uVar13 * 0x10);
  }
  return;
}

Assistant:

void set(base_iterator p)
                    {
                        size_t dist=std::distance(map_->begin(),p);
                        index_type::const_iterator b=map_->index().begin(),e=map_->index().end();
                        index_type::const_iterator 
                            boundary_point=std::upper_bound(b,e,break_info(dist));
                        while(boundary_point != e && (boundary_point->rule & mask_)==0)
                            boundary_point++;

                        current_.first = current_.second = boundary_point - b;
                        
                        if(full_select_) {
                            while(current_.first > 0) {
                                current_.first --;
                                if(valid_offset(current_.first))
                                    break;
                            }
                        }
                        else {
                            if(current_.first > 0)
                                current_.first --;
                        }
                        value_.first = map_->begin();
                        std::advance(value_.first,get_offset(current_.first));
                        value_.second = value_.first;
                        std::advance(value_.second,get_offset(current_.second) - get_offset(current_.first));

                        update_rule();
                    }